

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O1

c_v256 * c_v256_shuffle_8(c_v256 a,c_v256 pattern)

{
  undefined1 auVar1 [16];
  c_v128 cVar2;
  c_v128 cVar3;
  c_v256 *in_RDI;
  
  auVar1 = vpinsrb_avx(ZEXT116(a.u8[pattern.u8[0] & 0x1f]),(uint)a.u8[pattern.u8[1] & 0x1f],1);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[2] & 0x1f],2);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[3] & 0x1f],3);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[4] & 0x1f],4);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[5] & 0x1f],5);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[6] & 0x1f],6);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[7] & 0x1f],7);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[8] & 0x1f],8);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[9] & 0x1f],9);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[10] & 0x1f],10);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[0xb] & 0x1f],0xb);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[0xc] & 0x1f],0xc);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[0xd] & 0x1f],0xd);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[0xe] & 0x1f],0xe);
  cVar2 = (c_v128)vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[0xf] & 0x1f],0xf);
  auVar1 = vpinsrb_avx(ZEXT116(a.u8[pattern.u8[0x10] & 0x1f]),(uint)a.u8[pattern.u8[0x11] & 0x1f],1)
  ;
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[0x12] & 0x1f],2);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[0x13] & 0x1f],3);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[0x14] & 0x1f],4);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[0x15] & 0x1f],5);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[0x16] & 0x1f],6);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[0x17] & 0x1f],7);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[0x18] & 0x1f],8);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[0x19] & 0x1f],9);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[0x1a] & 0x1f],10);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[0x1b] & 0x1f],0xb);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[0x1c] & 0x1f],0xc);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[0x1d] & 0x1f],0xd);
  auVar1 = vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[0x1e] & 0x1f],0xe);
  cVar3 = (c_v128)vpinsrb_avx(auVar1,(uint)a.u8[pattern.u8[0x1f] & 0x1f],0xf);
  in_RDI->v128[1] = cVar3;
  in_RDI->v128[0] = cVar2;
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_shuffle_8(c_v256 a, c_v256 pattern) {
  c_v256 t;
  int c;
  for (c = 0; c < 32; c++)
    t.u8[c] = a.u8[CONFIG_BIG_ENDIAN ? 31 - (pattern.u8[c] & 31)
                                     : pattern.u8[c] & 31];

  return t;
}